

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void Error::reportErrorAtToken
               (ostream *out,string *phase,shared_ptr<const_Readable> *reader,
               shared_ptr<Token> *token,string *message)

{
  size_t sVar1;
  size_t sVar2;
  element_type *peVar3;
  ostream *poVar4;
  void *pvVar5;
  element_type *peVar6;
  ulong local_80;
  size_t i;
  string arrow;
  string line;
  size_t startofLine;
  string *message_local;
  shared_ptr<Token> *token_local;
  shared_ptr<const_Readable> *reader_local;
  string *phase_local;
  ostream *out_local;
  
  peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)token)
  ;
  if (peVar3->tokenType == EndOfFile) {
    poVar4 = std::operator<<(out,"At end of file an error was discovered during ");
    poVar4 = std::operator<<(poVar4,(string *)phase);
    poVar4 = std::operator<<(poVar4," phase:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)message);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        token);
    sVar1 = peVar3->sourceIndex;
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        token);
    sVar2 = peVar3->sourceColumn;
    peVar6 = std::__shared_ptr_access<const_Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)reader);
    (*peVar6->_vptr_Readable[4])
              ((undefined1 *)((long)&arrow.field_2 + 8),peVar6,sVar1 - (sVar2 - 1));
    std::__cxx11::string::string((string *)&i);
    local_80 = 1;
    while( true ) {
      peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          token);
      if (peVar3->sourceColumn <= local_80) break;
      std::__cxx11::string::append((char *)&i);
      local_80 = local_80 + 1;
    }
    std::__cxx11::string::append((char *)&i);
    poVar4 = std::operator<<(out,"On line ");
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        token);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar3->sourceLine);
    poVar4 = std::operator<<(poVar4," at column ");
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        token);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar3->sourceColumn);
    poVar4 = std::operator<<(poVar4," within source index at ");
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        token);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar3->sourceIndex);
    poVar4 = std::operator<<(poVar4," an error was discovered during ");
    poVar4 = std::operator<<(poVar4,(string *)phase);
    poVar4 = std::operator<<(poVar4," phase:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)message);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)(arrow.field_2._M_local_buf + 8));
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,(string *)&i);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)(arrow.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Error::reportErrorAtToken(
    std::ostream & out,
    const std::string & phase,
    const std::shared_ptr<const Readable>& reader,
    const std::shared_ptr<Token>& token,
    const std::string & message) {

  if (token->tokenType == TokenType::EndOfFile) {
    out
      << "At end of file an error was discovered during " << phase << " phase:" << std::endl
      << message << std::endl << std::endl;

  } else {
    std::size_t startofLine = token->sourceIndex - (token->sourceColumn - 1);
    auto line = reader->getLineFromIndex(startofLine);

    std::string arrow;

    for (std::size_t i = 1; i < token->sourceColumn; i++) {
      arrow.append("~");
    }

    arrow.append("^");

    out
      << "On line " << token->sourceLine
      << " at column " << token->sourceColumn
      << " within source index at " << token->sourceIndex
      << " an error was discovered during " << phase << " phase:" << std::endl
      << message << std::endl
      << line << std::endl
      << arrow << std::endl << std::endl;
  }
}